

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ExportAggregateFunctionBindData::Copy(ExportAggregateFunctionBindData *this)

{
  pointer pBVar1;
  ExportAggregateFunctionBindData *this_00;
  long in_RSI;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_18;
  
  pBVar1 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)(in_RSI + 8));
  (*(pBVar1->super_Expression).super_BaseExpression._vptr_BaseExpression[0x11])(&local_20,pBVar1);
  this_00 = (ExportAggregateFunctionBindData *)operator_new(0x10);
  local_18._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (Expression *)0x0;
  ExportAggregateFunctionBindData
            (this_00,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_18);
  if (local_18._M_head_impl != (Expression *)0x0) {
    (*((local_18._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)this_00;
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> ExportAggregateFunctionBindData::Copy() const {
	return make_uniq<ExportAggregateFunctionBindData>(aggregate->Copy());
}